

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O0

void draw_2_handles_for_line
               (int x1,int y1,int x2,int y2,bool filled,Am_Drawonable *draw,Am_Style *style,
               Am_Object *handle_shape,Am_Style *special_style,
               Am_Move_Grow_Where_Attach special_style_where)

{
  Am_Drawonable *draw_00;
  byte bVar1;
  bool bVar2;
  int left;
  int top;
  Am_Style *local_a0;
  Am_Style *local_78;
  Am_Style local_48 [3];
  Am_Style local_30;
  Am_Drawonable *local_28;
  Am_Drawonable *draw_local;
  int iStack_18;
  bool filled_local;
  int y2_local;
  int x2_local;
  int y1_local;
  int x1_local;
  Am_Move_Grow_Where_Attach special_style_where_local;
  
  y1_local = special_style_where.value;
  local_28 = draw;
  draw_local._3_1_ = filled;
  draw_local._4_4_ = y2;
  iStack_18 = x2;
  y2_local = y1;
  x2_local = x1;
  bVar2 = Am_Move_Grow_Where_Attach::operator==
                    ((Am_Move_Grow_Where_Attach *)&y1_local,&Am_ATTACH_END_1);
  if (bVar2) {
    local_78 = special_style;
  }
  else {
    local_78 = style;
  }
  Am_Style::Am_Style(&local_30,local_78);
  draw_handle(x1 + -7,y1 + -7,filled,draw,&local_30,handle_shape);
  Am_Style::~Am_Style(&local_30);
  bVar1 = draw_local._3_1_;
  draw_00 = local_28;
  left = iStack_18 + -7;
  top = draw_local._4_4_ + -7;
  bVar2 = Am_Move_Grow_Where_Attach::operator==
                    ((Am_Move_Grow_Where_Attach *)&y1_local,&Am_ATTACH_END_2);
  if (bVar2) {
    local_a0 = special_style;
  }
  else {
    local_a0 = style;
  }
  Am_Style::Am_Style(local_48,local_a0);
  draw_handle(left,top,(bool)(bVar1 & 1),draw_00,local_48,handle_shape);
  Am_Style::~Am_Style(local_48);
  return;
}

Assistant:

void
draw_2_handles_for_line(
    int x1, int y1, int x2, int y2, bool filled, Am_Drawonable *draw,
    Am_Style style,
    Am_Object &handle_shape, //supports multiple users
    Am_Style special_style = Am_No_Style,
    Am_Move_Grow_Where_Attach special_style_where = Am_ATTACH_WHERE_HIT // 0
    )
{
  draw_handle(x1 - HANDLE_SIZE_D2, y1 - HANDLE_SIZE_D2, filled, draw,
              (special_style_where == Am_ATTACH_END_1) ? special_style : style,
              handle_shape); //supports multiple users

  draw_handle(x2 - HANDLE_SIZE_D2, y2 - HANDLE_SIZE_D2, filled, draw,
              (special_style_where == Am_ATTACH_END_2) ? special_style : style,
              handle_shape); //supports multiple users
}